

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  _Rb_tree_color _Var1;
  char *__s;
  const_iterator cVar2;
  long *plVar3;
  TestFactoryBase *factory;
  _Base_ptr p_Var4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  string full_name;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  CodeLocation local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_148;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  size_type local_b8;
  _Base_ptr local_b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _func_int **local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_80;
  
  UnitTest::GetInstance();
  p_Var4 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var8) {
    local_a8 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    p_Var9 = &((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    local_b0 = p_Var9;
    do {
      if (*(char *)&p_Var4[3]._M_parent == '\0') {
        __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
               *)(p_Var4 + 1);
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_a8->_M_t,(key_type *)__k);
        if (cVar2._M_node == p_Var9) {
          std::operator+(&local_1d0,"Type parameterized test suite ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_1d0);
          local_1b0.file._M_dataplus._M_p = (pointer)&local_1b0.file.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_1b0.file.field_2._M_allocated_capacity = *psVar5;
            local_1b0.file.field_2._8_8_ = plVar3[3];
          }
          else {
            local_1b0.file.field_2._M_allocated_capacity = *psVar5;
            local_1b0.file._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_1b0.file._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b0,*(ulong *)(p_Var4 + 1));
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar6) {
            local_168.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_168.field_2._8_8_ = plVar3[3];
          }
          else {
            local_168.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_168._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_168._M_string_length = plVar3[1];
          *plVar3 = (long)paVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_168);
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_c8 = *plVar7;
            lStack_c0 = plVar3[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *plVar7;
            local_d8 = (long *)*plVar3;
          }
          local_d0 = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != &local_1b0.file.field_2) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_168,"UninstantiatedTypeParameterizedTestSuite<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_168);
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_e8 = *plVar7;
            lStack_e0 = plVar3[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar7;
            local_f8 = (long *)*plVar3;
          }
          local_f0 = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          plVar3 = local_f8;
          __s = *(char **)(p_Var4 + 2);
          _Var1 = p_Var4[3]._M_color;
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_d8,local_d0 + (long)local_d8);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_80,__k);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          local_b8 = 0x16;
          local_1d0._M_dataplus._M_p =
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_create(&local_1d0,&local_b8,0);
          local_1d0.field_2._M_allocated_capacity = local_b8;
          builtin_strncpy(local_1d0._M_dataplus._M_p,"GoogleTestVerification",0x16);
          local_1d0._M_string_length = local_b8;
          local_1d0._M_dataplus._M_p[local_b8] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,__s,(allocator<char> *)&local_b8);
          local_1b0.file._M_dataplus._M_p = (pointer)&local_1b0.file.field_2;
          if (local_188 == &local_178) {
            local_1b0.file.field_2._8_8_ = local_178._8_8_;
          }
          else {
            local_1b0.file._M_dataplus._M_p = (pointer)local_188;
          }
          local_1b0.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_
          ;
          local_1b0.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
          local_1b0.file._M_string_length = local_180;
          local_180 = 0;
          local_178._M_local_buf[0] = '\0';
          local_1b0.line = _Var1;
          local_188 = &local_178;
          factory = (TestFactoryBase *)operator_new(0x78);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          if (local_a0 == &local_90) {
            local_168.field_2._8_8_ = local_90._8_8_;
          }
          else {
            local_168._M_dataplus._M_p = (pointer)local_a0;
          }
          local_168.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
          local_168.field_2._M_local_buf[0] = local_90._M_local_buf[0];
          local_168._M_string_length = (size_type)local_98;
          local_98 = (_func_int **)0x0;
          local_90._M_local_buf[0] = '\0';
          local_a0 = &local_90;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_148,&local_80);
          factory->_vptr_TestFactoryBase =
               (_func_int **)
               (
               _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
               + 0x10);
          factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p == &local_168.field_2) {
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_168.field_2._M_allocated_capacity
            ;
            factory[4]._vptr_TestFactoryBase = (_func_int **)local_168.field_2._8_8_;
          }
          else {
            factory[1]._vptr_TestFactoryBase = (_func_int **)local_168._M_dataplus._M_p;
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_168.field_2._M_allocated_capacity
            ;
          }
          factory[2]._vptr_TestFactoryBase = (_func_int **)local_168._M_string_length;
          local_168._M_string_length = 0;
          local_168.field_2._M_allocated_capacity =
               local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
                  *)(factory + 5),&local_148);
          MakeAndRegisterTestInfo
                    (&local_1d0,(char *)plVar3,(char *)0x0,(char *)0x0,&local_1b0,
                     &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          p_Var9 = local_b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148.second.code_location.file._M_dataplus._M_p !=
              &local_148.second.code_location.file.field_2) {
            operator_delete(local_148.second.code_location.file._M_dataplus._M_p,
                            local_148.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
            operator_delete(local_148.first._M_dataplus._M_p,
                            local_148.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0.file._M_dataplus._M_p != &local_1b0.file.field_2) {
            operator_delete(local_1b0.file._M_dataplus._M_p,
                            local_1b0.file.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,
                            CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.second.code_location.file._M_dataplus._M_p !=
              &local_80.second.code_location.file.field_2) {
            operator_delete(local_80.second.code_location.file._M_dataplus._M_p,
                            local_80.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,
                                              local_90._M_local_buf[0]) + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var8);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get "
        "other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following "
        "line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}